

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::Capturer::~Capturer(Capturer *this)

{
  size_type sVar1;
  IResultCapture *pIVar2;
  bool bVar3;
  size_type sVar4;
  reference pvVar5;
  ulong local_18;
  size_t i;
  Capturer *this_local;
  
  bVar3 = uncaught_exceptions();
  if (!bVar3) {
    sVar1 = this->m_captured;
    sVar4 = clara::std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::size
                      (&this->m_messages);
    if (sVar1 != sVar4) {
      __assert_fail("m_captured == m_messages.size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/LanderN[P]modern-coapp/build_O0/_deps/catch2-src/single_include/catch2/catch.hpp"
                    ,0x2e8c,"Catch::Capturer::~Capturer()");
    }
    for (local_18 = 0; local_18 < this->m_captured; local_18 = local_18 + 1) {
      pIVar2 = this->m_resultCapture;
      pvVar5 = clara::std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::
               operator[](&this->m_messages,local_18);
      (*pIVar2->_vptr_IResultCapture[7])(pIVar2,pvVar5);
    }
  }
  clara::std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::~vector
            (&this->m_messages);
  return;
}

Assistant:

Capturer::~Capturer() {
        if ( !uncaught_exceptions() ){
            assert( m_captured == m_messages.size() );
            for( size_t i = 0; i < m_captured; ++i  )
                m_resultCapture.popScopedMessage( m_messages[i] );
        }
    }